

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alconfig.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::expdup_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *str)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  string *extraout_RAX;
  string *psVar6;
  long *plVar7;
  string *psVar8;
  size_t sVar9;
  string envname;
  string envval;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  long *local_b8 [2];
  long local_a8 [2];
  string *local_98;
  size_t local_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50;
  undefined8 local_48;
  undefined1 local_40;
  uint7 uStack_3f;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_98 = (string *)local_88;
  local_90 = 0;
  local_88[0] = 0;
  while (cVar1 = *(char *)&(((string *)this)->_M_dataplus)._M_p, cVar1 == '$') {
    psVar6 = (string *)((long)&(((string *)this)->_M_dataplus)._M_p + 1);
    cVar1 = *(char *)((long)&(((string *)this)->_M_dataplus)._M_p + 1);
    psVar8 = (string *)((long)&(((string *)this)->_M_dataplus)._M_p + 2);
    if (cVar1 == '$') {
      pcVar4 = strchr((char *)psVar8,0x24);
      if (pcVar4 == (char *)0x0) {
        sVar9 = strlen((char *)psVar6);
      }
      else {
        sVar9 = (long)pcVar4 - (long)psVar6;
      }
      psVar8 = (string *)((long)&(psVar6->_M_dataplus)._M_p + sVar9);
      goto LAB_0013c92c;
    }
    if (cVar1 != '{') {
      psVar8 = psVar6;
    }
    this = (_anonymous_namespace_ *)((long)&psVar8[-1].field_2 + 0xf);
    do {
      do {
        cVar2 = *(char *)((long)&(((string *)this)->_M_dataplus)._M_p + 1);
        this = (_anonymous_namespace_ *)((long)&(((string *)this)->_M_dataplus)._M_p + 1);
        iVar3 = isalnum((int)cVar2);
      } while (cVar2 == 0x5f);
    } while (iVar3 != 0);
    if ((cVar1 != '{') || (cVar2 == '}')) {
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,psVar8,this);
      al::getenv_abi_cxx11_((al *)(local_88 + 0x10),(char *)local_b8[0]);
      local_48 = 0;
      local_40 = 0;
      local_d8 = &local_c8;
      if (local_78._M_local_buf[0] == '\x01') {
        if ((long *)local_78._8_8_ == &local_60) {
          uStack_c0 = uStack_58;
        }
        else {
          local_d8 = (long *)local_78._8_8_;
        }
        local_c8 = local_60;
        local_d0 = local_68;
        puVar5 = &local_68;
        plVar7 = &local_60;
        local_78._8_8_ = &local_60;
      }
      else {
        local_c8 = (ulong)uStack_3f << 8;
        uStack_c0 = uStack_38;
        local_d0 = 0;
        puVar5 = &local_48;
        plVar7 = (long *)&local_40;
      }
      local_50 = (long *)&local_40;
      *puVar5 = 0;
      *(undefined1 *)plVar7 = 0;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_50 != (long *)&local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if ((local_78._M_local_buf[0] == '\x01') && ((long *)local_78._8_8_ != &local_60)) {
        operator_delete((void *)local_78._8_8_,local_60 + 1);
      }
      sVar9 = local_90;
      psVar6 = local_98;
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      psVar8 = (string *)((long)&(((string *)this)->_M_dataplus)._M_p + (ulong)(cVar1 == '{'));
LAB_0013c92c:
      this = (_anonymous_namespace_ *)psVar8;
      if (sVar9 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)psVar6);
      }
    }
  }
  if (cVar1 == '\0') {
    psVar6 = (string *)local_88;
    if (local_98 != psVar6) {
      operator_delete(local_98,CONCAT71(local_88._1_7_,local_88[0]) + 1);
      psVar6 = extraout_RAX;
    }
    return psVar6;
  }
  pcVar4 = strchr((char *)this,0x24);
  if (pcVar4 == (char *)0x0) {
    sVar9 = strlen((char *)this);
  }
  else {
    sVar9 = (long)pcVar4 - (long)this;
  }
  psVar8 = (string *)((long)&(((string *)this)->_M_dataplus)._M_p + sVar9);
  psVar6 = (string *)this;
  goto LAB_0013c92c;
}

Assistant:

std::string expdup(const char *str)
{
    std::string output;

    std::string envval;
    while(*str != '\0')
    {
        const char *addstr;
        size_t addstrlen;

        if(str[0] != '$')
        {
            const char *next = std::strchr(str, '$');
            addstr = str;
            addstrlen = next ? static_cast<size_t>(next-str) : std::strlen(str);

            str += addstrlen;
        }
        else
        {
            str++;
            if(*str == '$')
            {
                const char *next = std::strchr(str+1, '$');
                addstr = str;
                addstrlen = next ? static_cast<size_t>(next-str) : std::strlen(str);

                str += addstrlen;
            }
            else
            {
                const bool hasbraces{(*str == '{')};

                if(hasbraces) str++;
                const char *envstart = str;
                while(std::isalnum(*str) || *str == '_')
                    ++str;
                if(hasbraces && *str != '}')
                    continue;
                const std::string envname{envstart, str};
                if(hasbraces) str++;

                envval = al::getenv(envname.c_str()).value_or(std::string{});
                addstr = envval.data();
                addstrlen = envval.length();
            }
        }
        if(addstrlen == 0)
            continue;

        output.append(addstr, addstrlen);
    }

    return output;
}